

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::averageDownSolutionRHS
          (MLNodeLaplacian *this,int camrlev,MultiFab *crse_sol,MultiFab *crse_rhs,
          MultiFab *fine_sol,MultiFab *fine_rhs)

{
  int rr;
  int iVar1;
  FabFactory<amrex::FArrayBox> local_1d8;
  MFInfo local_1d0;
  MultiFab frhs;
  
  rr = (this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
       super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl
       .super__Vector_impl_data._M_start[camrlev];
  average_down(fine_sol,crse_sol,0,1,rr);
  iVar1 = (*(this->super_MLNodeLinOp).super_MLLinOp._vptr_MLLinOp[0x1e])(this,0);
  if ((char)iVar1 != '\0') {
    local_1d0.alloc = true;
    local_1d0._1_7_ = 0;
    local_1d0.arena = (Arena *)0x0;
    local_1d0.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d0.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d0.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1d8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
    MultiFab::MultiFab(&frhs,&(fine_rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                              boxarray,
                       &(fine_rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                        distributionMap,1,rr + -1,&local_1d0,&local_1d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d0.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    MultiFab::Copy(&frhs,fine_rhs,0,0,1,0);
    restrictInteriorNodes(this,camrlev,crse_rhs,&frhs);
    MultiFab::~MultiFab(&frhs);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::averageDownSolutionRHS (int camrlev, MultiFab& crse_sol, MultiFab& crse_rhs,
                                         const MultiFab& fine_sol, const MultiFab& fine_rhs)
{
    const auto& amrrr = AMRRefRatio(camrlev);
    amrex::average_down(fine_sol, crse_sol, 0, 1, amrrr);

    if (isSingular(0))
    {
        MultiFab frhs(fine_rhs.boxArray(), fine_rhs.DistributionMap(), 1, amrrr-1);
        MultiFab::Copy(frhs, fine_rhs, 0, 0, 1, 0);
        restrictInteriorNodes(camrlev, crse_rhs, frhs);
    }
}